

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O0

int LZ4_compressHC_limitedOutput_withStateHC
              (void *state,char *src,char *dst,int srcSize,int maxDstSize)

{
  int iVar1;
  int maxDstSize_local;
  int srcSize_local;
  char *dst_local;
  char *src_local;
  void *state_local;
  
  iVar1 = LZ4_compress_HC_extStateHC(state,src,dst,srcSize,maxDstSize,0);
  return iVar1;
}

Assistant:

int LZ4_compressHC_limitedOutput_withStateHC (void* state, const char* src, char* dst, int srcSize, int maxDstSize) { return LZ4_compress_HC_extStateHC (state, src, dst, srcSize, maxDstSize, 0); }